

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_392279::MLKEMTest_NistDecap1024TestVectors_Test::TestBody
          (MLKEMTest_NistDecap1024TestVectors_Test *this)

{
  function<void_(FileTest_*)> local_30;
  MLKEMTest_NistDecap1024TestVectors_Test *local_10;
  MLKEMTest_NistDecap1024TestVectors_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,
             MLKEMNistDecapFileTest<MLKEM1024_private_key,_&(anonymous_namespace)::wrapper_1024_parse_private_key,_&MLKEM1024_decap>
            );
  FileTestGTest("crypto/mlkem/mlkem1024_nist_decap_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(MLKEMTest, NistDecap1024TestVectors) {
  FileTestGTest(
      "crypto/mlkem/mlkem1024_nist_decap_tests.txt",
      MLKEMNistDecapFileTest<MLKEM1024_private_key,
                             wrapper_1024_parse_private_key, MLKEM1024_decap>);
}